

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O2

void com_alf_init_map(com_seqh_t *seqhdr,u8 *alf_idx_map)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  iVar1 = seqhdr->max_cuwh;
  iVar9 = seqhdr->pic_height_in_lcu;
  uVar2 = seqhdr->pic_width_in_lcu;
  iVar4 = ((int)(uVar2 + 1) / 4) * iVar1;
  iVar8 = ((iVar9 + 1) / 4) * iVar1;
  iVar5 = 0;
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  seqhdr->alf_idx_map = alf_idx_map;
  for (; iVar5 != iVar9; iVar5 = iVar5 + 1) {
    iVar10 = 0xc;
    if ((iVar8 != 0) && (iVar7 = (iVar5 * iVar1) / iVar8, iVar10 = iVar7 * 4, 3 < iVar7)) {
      iVar10 = 0xc;
    }
    iVar7 = 0;
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = 3;
      if ((iVar4 != 0) && (iVar3 = iVar7 / iVar4, 2 < iVar3)) {
        iVar3 = 3;
      }
      alf_idx_map[uVar6] = (&DAT_00159ab0)[(long)(iVar3 + iVar10) * 4];
      iVar7 = iVar7 + iVar1;
    }
    alf_idx_map = alf_idx_map + (int)uVar2;
  }
  return;
}

Assistant:

void com_alf_init_map(com_seqh_t *seqhdr, u8 *alf_idx_map)
{
    const int tab_region[NO_VAR_BINS] = { 0, 1, 4, 5, 15, 2, 3, 6, 14, 11, 10, 7, 13, 12,  9,  8 };
    int lcu_size = seqhdr->max_cuwh;
    int img_width_in_lcu  = seqhdr->pic_width_in_lcu;
    int img_height_in_lcu = seqhdr->pic_height_in_lcu;
    int regin_w = ((img_width_in_lcu  + 1) / 4 * lcu_size);
    int regin_h = ((img_height_in_lcu + 1) / 4 * lcu_size);

    seqhdr->alf_idx_map = alf_idx_map;

    for (int i = 0; i < img_height_in_lcu; i++) {
        int offset_y = (regin_h ? COM_MIN(3, (i * lcu_size) / regin_h) : 3) << 2;

        for (int j = 0; j < img_width_in_lcu; j++) {
            int offset_x = (regin_w ? COM_MIN(3, (j * lcu_size) / regin_w) : 3);
            alf_idx_map[j] = tab_region[offset_y + offset_x];
        }
        alf_idx_map += img_width_in_lcu;
    }
}